

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O3

EVP_PKEY * read_key(char *filename)

{
  int iVar1;
  FILE *pFVar2;
  EVP_PKEY *pEVar3;
  X509_REQ *pXVar4;
  undefined4 extraout_var;
  PKCS7_ISSUER_AND_SUBJECT *pPVar5;
  PKCS7_ISSUER_AND_SERIAL *pPVar6;
  char *pcVar7;
  
  iVar1 = 0x110ac6;
  pFVar2 = fopen(filename,"r");
  if (pFVar2 == (FILE *)0x0) {
    read_key_cold_2();
  }
  else {
    iVar1 = 0;
    pEVar3 = PEM_read_PrivateKey(pFVar2,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
    if (pEVar3 != (EVP_PKEY *)0x0) {
      fclose(pFVar2);
      return (EVP_PKEY *)pEVar3;
    }
  }
  read_key_cold_1();
  if (r_flag != 0) {
    iVar1 = 0x110ac6;
    filename = r_char;
    pFVar2 = fopen(r_char,"r");
    if (pFVar2 != (FILE *)0x0) {
      iVar1 = 0x116740;
      filename = (char *)pFVar2;
      pXVar4 = PEM_read_X509_REQ(pFVar2,(X509_REQ **)&request,(undefined1 *)0x0,(void *)0x0);
      if (pXVar4 != (X509_REQ *)0x0) {
        iVar1 = fclose(pFVar2);
        return (EVP_PKEY *)CONCAT44(extraout_var,iVar1);
      }
      goto LAB_0010e5e2;
    }
  }
  read_request_cold_2();
LAB_0010e5e2:
  read_request_cold_1();
  memset(filename,0,0xd8);
  *(undefined4 *)&((FILE *)filename)->_IO_write_base = 99;
  ((FILE *)filename)->_IO_buf_base = (char *)0x0;
  pPVar5 = PKCS7_ISSUER_AND_SUBJECT_new();
  ((FILE *)filename)->__pad2 = pPVar5;
  pPVar6 = PKCS7_ISSUER_AND_SERIAL_new();
  ((FILE *)filename)->__pad3 = pPVar6;
  pPVar6 = PKCS7_ISSUER_AND_SERIAL_new();
  ((FILE *)filename)->__pad4 = pPVar6;
  if (iVar1 == 3) {
    pcVar7 = key_fingerprint(request);
  }
  else {
    pcVar7 = "SSCEP transactionId";
  }
  ((FILE *)filename)->_IO_buf_end = pcVar7;
  if (v_flag != 0) {
    printf("%s: transaction id: %s\n",pname);
  }
  return (EVP_PKEY *)0x0;
}

Assistant:

EVP_PKEY *
read_key(char* filename)
{
	FILE *file;
	EVP_PKEY *res;
	/* Read private key file */
#ifdef WIN32
	if ((fopen_s(&file, filename, "r")))
#else
	if (!(file = fopen(filename, "r")))
#endif
	{
	    fprintf(stderr, "%s: cannot open private key file %s\n", pname, filename);
		exit (SCEP_PKISTATUS_FILE);
	}
	if (!(res = PEM_read_PrivateKey(file, NULL, NULL, NULL))) {
	        fprintf(stderr, "%s: error while reading private key %s\n", pname, filename);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_FILE);
	}
	fclose(file);
	return res;
}